

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O2

size_t __thiscall remote::Handle::GetModuleAddress(Handle *this,string *name)

{
  bool bVar1;
  int iVar2;
  Region *pRVar3;
  size_t unaff_R13;
  vector<remote::Region,_std::allocator<remote::Region>_> regions;
  Region reg;
  vector<remote::Region,_std::allocator<remote::Region>_> local_c0;
  undefined1 local_a8 [120];
  
  bVar1 = IsRunning(this);
  if (bVar1) {
    GetRegions(&local_c0,this);
    do {
      pRVar3 = local_c0.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pRVar3 == local_c0.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>.
                    _M_impl.super__Vector_impl_data._M_finish) break;
      Region::Region((Region *)local_a8,pRVar3);
      iVar2 = std::__cxx11::string::compare((string *)(local_a8 + 0x58));
      unaff_R13 = local_a8._0_8_;
      Region::~Region((Region *)local_a8);
      local_c0.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
      super__Vector_impl_data._M_start = pRVar3 + 1;
    } while (iVar2 != 0);
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_c0);
    if (pRVar3 != local_c0.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      return unaff_R13;
    }
  }
  return 0;
}

Assistant:

size_t Handle::GetModuleAddress(string name) {
    if(IsRunning()) {
        vector<Region> regions = GetRegions();

        // These are ordered by memory start in maps
        // So first result is fine
        for(auto reg : regions) {
            if(reg.filename.compare(name) == 0) {
                return reg.start;
            }
        }
    }

    return 0;
}